

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

vector<soul::Type,_std::allocator<soul::Type>_> * __thiscall
soul::AST::EndpointDetails::getResolvedDataTypes
          (vector<soul::Type,_std::allocator<soul::Type>_> *__return_storage_ptr__,
          EndpointDetails *this)

{
  size_t sVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  long *plVar3;
  char cVar4;
  long lVar5;
  Type local_40;
  
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::reserve
            (__return_storage_ptr__,(this->dataTypes).numActive);
  sVar1 = (this->dataTypes).numActive;
  if (sVar1 != 0) {
    ppVar2 = (this->dataTypes).items;
    lVar5 = 0;
    do {
      plVar3 = *(long **)((long)&ppVar2->object + lVar5);
      if ((int)plVar3[5] != 1) {
LAB_001fc23f:
        throwInternalCompilerError("isResolvedAsType (t.get())","getResolvedDataTypes",0x3e2);
      }
      cVar4 = (**(code **)(*plVar3 + 0x18))();
      if (cVar4 == '\0') goto LAB_001fc23f;
      (**(code **)(**(long **)((long)&ppVar2->object + lVar5) + 0x28))(&local_40);
      std::vector<soul::Type,_std::allocator<soul::Type>_>::emplace_back<soul::Type>
                (__return_storage_ptr__,&local_40);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_40.structure.object);
      lVar5 = lVar5 + 8;
    } while (sVar1 << 3 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> getResolvedDataTypes() const
        {
            std::vector<Type> types;
            types.reserve (dataTypes.size());

            for (auto& t : dataTypes)
            {
                SOUL_ASSERT (isResolvedAsType (t.get()));
                types.push_back (t->resolveAsType());
            }

            return types;
        }